

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

mp_limb_t mpn_div_qr_1_preinv(mp_ptr qp,mp_srcptr np,mp_size_t nn,gmp_div_inverse *inv)

{
  uint uVar1;
  ulong uVar2;
  mp_ptr pmVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  mp_size_t mVar10;
  ulong uVar11;
  mp_srcptr pmVar12;
  ulong uVar13;
  mp_limb_t mVar14;
  ulong uVar15;
  mp_limb_t __u;
  ulong uVar16;
  ulong uVar17;
  
  uVar1 = inv->shift;
  if (uVar1 == 0) {
    bVar5 = 0;
    mVar10 = 0;
    pmVar3 = (mp_srcptr)0x0;
    uVar16 = 0;
  }
  else {
    if (qp == (mp_ptr)0x0) {
      pmVar3 = (mp_ptr)(*gmp_allocate_func)(nn * 8);
      uVar1 = inv->shift;
      mVar10 = nn;
    }
    else {
      pmVar3 = qp;
      mVar10 = 0;
    }
    pmVar12 = pmVar3 + nn;
    bVar5 = (byte)uVar1;
    uVar16 = np[nn + -1];
    mVar14 = uVar16 << (bVar5 & 0x3f);
    lVar8 = nn;
    if (nn != 1) {
      do {
        uVar2 = np[lVar8 + -2];
        pmVar12[-1] = uVar2 >> (0x40 - bVar5 & 0x3f) | mVar14;
        mVar14 = uVar2 << (bVar5 & 0x3f);
        pmVar12 = pmVar12 + -1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 1);
    }
    uVar16 = uVar16 >> (0x40 - bVar5 & 0x3f);
    pmVar12[-1] = mVar14;
    np = pmVar3;
  }
  if (0 < nn) {
    uVar2 = inv->d1;
    uVar6 = inv->di & 0xffffffff;
    uVar11 = inv->di >> 0x20;
    uVar17 = nn + 1;
    do {
      uVar7 = (uVar16 & 0xffffffff) * uVar6;
      uVar4 = (uVar16 >> 0x20) * uVar6;
      lVar9 = (uVar16 >> 0x20) * uVar11;
      uVar13 = (uVar16 & 0xffffffff) * uVar11 + uVar4 + (uVar7 >> 0x20);
      lVar8 = lVar9 + 0x100000000;
      if (uVar4 <= uVar13) {
        lVar8 = lVar9;
      }
      uVar7 = uVar7 & 0xffffffff | uVar13 << 0x20;
      uVar4 = np[uVar17 - 2];
      uVar15 = uVar7 + uVar4;
      lVar8 = uVar16 + 1 + (uVar13 >> 0x20) + lVar8 + (ulong)CARRY8(uVar7,uVar4);
      uVar4 = uVar4 - lVar8 * uVar2;
      uVar16 = 0;
      if (uVar15 < uVar4) {
        uVar16 = uVar2;
      }
      uVar16 = uVar16 + uVar4;
      uVar7 = 0;
      if (uVar2 <= uVar16) {
        uVar7 = uVar2;
      }
      if (qp != (mp_ptr)0x0) {
        qp[uVar17 - 2] = ((lVar8 - (ulong)(uVar15 < uVar4)) + 1) - (ulong)(uVar16 < uVar2);
      }
      uVar16 = uVar16 - uVar7;
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
  }
  if (mVar10 != 0) {
    (*gmp_free_func)(pmVar3,mVar10 << 3);
    bVar5 = (byte)inv->shift;
  }
  return uVar16 >> (bVar5 & 0x3f);
}

Assistant:

static mp_limb_t
mpn_div_qr_1_preinv (mp_ptr qp, mp_srcptr np, mp_size_t nn,
		     const struct gmp_div_inverse *inv)
{
  mp_limb_t d, di;
  mp_limb_t r;
  mp_ptr tp = NULL;
  mp_size_t tn = 0;

  if (inv->shift > 0)
    {
      /* Shift, reusing qp area if possible. In-place shift if qp == np. */
      tp = qp;
      if (!tp)
        {
	   tn = nn;
	   tp = gmp_alloc_limbs (tn);
        }
      r = mpn_lshift (tp, np, nn, inv->shift);
      np = tp;
    }
  else
    r = 0;

  d = inv->d1;
  di = inv->di;
  while (--nn >= 0)
    {
      mp_limb_t q;

      gmp_udiv_qrnnd_preinv (q, r, r, np[nn], d, di);
      if (qp)
	qp[nn] = q;
    }
  if (tn)
    gmp_free_limbs (tp, tn);

  return r >> inv->shift;
}